

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Player.cpp
# Opt level: O0

string * decode(string *stringToDecode)

{
  string_view str;
  string_view jsonString;
  bool bVar1;
  int iVar2;
  reference pvVar3;
  string *in_RDI;
  __sv_type _Var4;
  exception *anon_var_0;
  size_t in_stack_00000068;
  string_view in_stack_00000070;
  int offset;
  char *in_stack_ffffffffffffff68;
  string *element;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff80;
  undefined1 in_stack_ffffffffffffffa8 [16];
  char *pcVar5;
  undefined4 in_stack_ffffffffffffffe8;
  
  element = in_RDI;
  bVar1 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
          empty((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x1e56f1);
  if (bVar1) {
    std::__cxx11::string::string(in_stack_ffffffffffffff80);
  }
  else {
    _Var4 = std::__cxx11::string::operator_cast_to_basic_string_view(in_RDI);
    pcVar5 = _Var4._M_str;
    str._M_str = in_stack_ffffffffffffff68;
    str._M_len = 0x1e572c;
    iVar2 = hasB64Wrapper(str);
    if (iVar2 == 0) {
      pvVar3 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
               ::front(in_RDI);
      if ((*pvVar3 != '\"') &&
         (pvVar3 = CLI::std::__cxx11::
                   basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::front(in_RDI),
         *pvVar3 != '\'')) {
        std::__cxx11::string::string
                  (in_stack_ffffffffffffffa8._8_8_,in_stack_ffffffffffffffa8._0_8_);
        return element;
      }
      std::__cxx11::string::operator_cast_to_basic_string_view(in_RDI);
      jsonString._M_str._0_4_ = in_stack_ffffffffffffffe8;
      jsonString._M_len = (size_t)pcVar5;
      jsonString._M_str._4_4_ = iVar2;
      helics::fileops::loadJsonStr_abi_cxx11_(jsonString);
      helics::fileops::JsonAsString((json *)element);
      nlohmann::json_abi_v3_11_3::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
      ::~basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                     *)in_RDI);
    }
    else {
      pvVar3 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
               ::back(in_RDI);
      if (*pvVar3 == '\"') {
        CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
        pop_back(in_RDI);
      }
      CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::pop_back
                (in_RDI);
      std::__cxx11::string::operator_cast_to_basic_string_view(in_RDI);
      gmlc::utilities::base64_decode_to_string_abi_cxx11_(in_stack_00000070,in_stack_00000068);
    }
  }
  return element;
}

Assistant:

static std::string decode(std::string&& stringToDecode)
{
    if (stringToDecode.empty()) {
        return std::string();
    }
    auto offset = hasB64Wrapper(stringToDecode);
    if (offset != 0) {
        if (stringToDecode.back() == '\"') {
            stringToDecode.pop_back();
        }

        stringToDecode.pop_back();
        return gmlc::utilities::base64_decode_to_string(stringToDecode, offset);
    }

    if ((stringToDecode.front() == '"') || (stringToDecode.front() == '\'')) {
        try {
            return helics::fileops::JsonAsString(helics::fileops::loadJsonStr(stringToDecode));
        }
        catch (const nlohmann::json::exception&) {
            return gmlc::utilities::stringOps::removeQuotes(stringToDecode);
        }
    }
    // move is required since you are returning the rvalue and we want to move from the rvalue input
    return std::move(stringToDecode);
}